

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * __thiscall
kratos::port_type_to_str_abi_cxx11_(string *__return_storage_ptr__,kratos *this,PortType type)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  PortType type_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"data",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"clk",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"async_reset",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"reset",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"clk_en",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  default:
    this_00 = (runtime_error *)
              __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,type));
    std::runtime_error::runtime_error(this_00,"unknown port type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string port_type_to_str(PortType type) {
    switch (type) {
        case PortType::Reset:
            return "reset";
        case PortType::Data:
            return "data";
        case PortType ::ClockEnable:
            return "clk_en";
        case PortType ::Clock:
            return "clk";
        case PortType ::AsyncReset:
            return "async_reset";
        default:
            throw std::runtime_error("unknown port type");
    }
}